

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::SetDefaultFieldValuePrinter
          (Printer *this,FieldValuePrinter *printer)

{
  FieldValuePrinterWrapper *this_00;
  long in_RDI;
  FieldValuePrinter *in_stack_ffffffffffffffc8;
  
  this_00 = (FieldValuePrinterWrapper *)(in_RDI + 0x18);
  operator_new(0x10);
  anon_unknown_19::FieldValuePrinterWrapper::FieldValuePrinterWrapper
            (this_00,in_stack_ffffffffffffffc8);
  std::
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  ::reset((unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
           *)this_00,(pointer)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void TextFormat::Printer::SetDefaultFieldValuePrinter(
    const FieldValuePrinter* printer) {
  default_field_value_printer_.reset(new FieldValuePrinterWrapper(printer));
}